

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::script_standard_push::test_method(script_standard_push *this)

{
  long lVar1;
  readonly_property65 rVar2;
  bool bVar3;
  int iVar4;
  CScript *pCVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  char *in_stack_fffffffffffffdc0;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  BaseSignatureChecker local_200;
  assertion_result local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 local_18c [4];
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  assertion_result local_148;
  char *local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  BaseSignatureChecker *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  ScriptError err;
  undefined1 local_98 [32];
  undefined1 local_78 [24];
  string *psStack_60;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  while (local_200._vptr_BaseSignatureChecker._0_4_ = iVar4, iVar4 < 67000) {
    script.super_CScriptBase._union._16_8_ = 0;
    script.super_CScriptBase._24_8_ = 0;
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    script.super_CScriptBase._union._8_8_ = 0;
    CScript::push_int64(&script,(long)iVar4);
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x517;
    file.m_begin = (iterator)&local_b0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
    rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CScript::IsPushOnly(&script);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_0114c470;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c8 = (BaseSignatureChecker *)0xbe3772;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_0114c4b0;
    local_98._16_8_ = &local_e0;
    local_98._24_8_ = &local_200;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_0114c4f0;
    psStack_60 = (string *)0xbe377a;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_e8 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_78._16_8_ = (string *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,(lazy_ostream *)local_78,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_f0,0x517);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x518;
    file_00.m_begin = (iterator)&local_100;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
               msg_00);
    local_78._16_8_ = 0;
    psStack_60 = (string *)0x0;
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_78,OP_1);
    local_1f8._0_8_ = &PTR_CheckECDSASignature_0114c3f0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         VerifyScript(&script,pCVar5,(CScriptWitness *)0x0,0x40,(BaseSignatureChecker *)&local_1f8,
                      &err);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.m_message.px = (element_type *)((ulong)local_148.m_message.px & 0xffffffffffffff00);
    local_148._0_8_ = &PTR__lazy_ostream_0114c470;
    local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_130 = "Number ";
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_0114c4b0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)&local_148;
    local_c8 = &local_200;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_0114c530;
    local_98._16_8_ = &local_e0;
    local_98._24_8_ = " push is not minimal data.";
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_150 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&data,(lazy_ostream *)local_98,1,1,WARN,
               (check_type)in_stack_fffffffffffffdc0,(size_t)&local_158,0x518);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_160 = "";
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x519;
    file_01.m_begin = (iterator)&local_168;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
               msg_01);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_OK);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    ScriptErrorString_abi_cxx11_((string *)local_98,err);
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_01147fb0;
    local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_180 = "";
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    psStack_60 = (string *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_78,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_188,0x519);
    std::__cxx11::string::~string((string *)local_98);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
    iVar4 = (int)local_200._vptr_BaseSignatureChecker + 1;
  }
  for (local_18c = (undefined1  [4])0x0; (uint)local_18c < 0x209;
      local_18c = (undefined1  [4])((int)local_18c + 1)) {
    script.super_CScriptBase._union.direct[0] = 0x49;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&data,(ulong)(uint)local_18c,(value_type_conflict3 *)&script.super_CScriptBase,
               (allocator_type *)local_78);
    script.super_CScriptBase._union._16_8_ = 0;
    script.super_CScriptBase._24_8_ = 0;
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    script.super_CScriptBase._union._8_8_ = 0;
    CScript::operator<<((CScript *)&script.super_CScriptBase,&data);
    local_1a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x520;
    file_02.m_begin = (iterator)&local_1a0;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
               msg_02);
    rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CScript::IsPushOnly((CScript *)&script.super_CScriptBase);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_0114c470;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c8 = (BaseSignatureChecker *)0xbe37a8;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_0114c570;
    local_98._16_8_ = &local_e0;
    local_98._24_8_ = local_18c;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_0114c5b0;
    psStack_60 = (string *)0xbe377a;
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_1b8 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    local_78._16_8_ = (string *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,(lazy_ostream *)local_78,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_1c0,0x520);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
    local_1d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_1c8 = "";
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x521;
    file_03.m_begin = (iterator)&local_1d0;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
               msg_03);
    local_78._16_8_ = 0;
    psStack_60 = (string *)0x0;
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_78,OP_1);
    local_200._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_0114c3f0;
    bVar3 = VerifyScript((CScript *)&script.super_CScriptBase,pCVar5,(CScriptWitness *)0x0,0x40,
                         &local_200,&err);
    local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar3;
    local_1f8.m_message.px = (element_type *)0x0;
    local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148.m_message.px = (element_type *)((ulong)local_148.m_message.px & 0xffffffffffffff00);
    local_148._0_8_ = &PTR__lazy_ostream_0114c470;
    local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_130 = "Length ";
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_0114c570;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)&local_148;
    local_c8 = (BaseSignatureChecker *)local_18c;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_0114c5f0;
    local_98._16_8_ = &local_e0;
    local_98._24_8_ = " push is not minimal data.";
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_208 = "";
    pvVar6 = &DAT_00000001;
    pvVar7 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_1f8,(lazy_ostream *)local_98,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_210,0x521);
    boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x522;
    file_04.m_begin = (iterator)&local_220;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
               msg_04);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_OK);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    ScriptErrorString_abi_cxx11_((string *)local_98,err);
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_01147fb0;
    local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
    in_stack_fffffffffffffdc0 =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    psStack_60 = (string *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_78,1,1,WARN,0xbe1280,(size_t)&stack0xfffffffffffffdc0
               ,0x522);
    std::__cxx11::string::~string((string *)local_98);
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_push)
{
    ScriptError err;
    for (int i=0; i<67000; i++) {
        CScript script;
        script << i;
        BOOST_CHECK_MESSAGE(script.IsPushOnly(), "Number " << i << " is not pure push.");
        BOOST_CHECK_MESSAGE(VerifyScript(script, CScript() << OP_1, nullptr, SCRIPT_VERIFY_MINIMALDATA, BaseSignatureChecker(), &err), "Number " << i << " push is not minimal data.");
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    }

    for (unsigned int i=0; i<=MAX_SCRIPT_ELEMENT_SIZE; i++) {
        std::vector<unsigned char> data(i, '\111');
        CScript script;
        script << data;
        BOOST_CHECK_MESSAGE(script.IsPushOnly(), "Length " << i << " is not pure push.");
        BOOST_CHECK_MESSAGE(VerifyScript(script, CScript() << OP_1, nullptr, SCRIPT_VERIFY_MINIMALDATA, BaseSignatureChecker(), &err), "Length " << i << " push is not minimal data.");
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    }
}